

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void sublist(char *s,int *skip,int *count,int *numargs)

{
  tagval *ptVar1;
  bool bVar2;
  char *pcVar3;
  bool local_71;
  int local_64;
  int *local_60;
  char *qend;
  char *qstart;
  char *end;
  char *start;
  char *list;
  int local_30;
  int i;
  int len;
  int offset;
  int *numargs_local;
  int *count_local;
  int *skip_local;
  char *s_local;
  
  _len = numargs;
  numargs_local = count;
  count_local = skip;
  skip_local = (int *)s;
  i = max<int>(*skip,0);
  if (*_len < 3) {
    local_64 = -1;
  }
  else {
    local_64 = max<int>(*numargs_local,0);
  }
  local_30 = local_64;
  list._4_4_ = 0;
  while ((list._4_4_ < i &&
         (bVar2 = parselist((char **)&skip_local,&liststart,&listend,&listquotestart,&listquoteend),
         bVar2))) {
    list._4_4_ = list._4_4_ + 1;
  }
  if (local_30 < 0) {
    if (0 < i) {
      skiplist((char **)&skip_local);
    }
    ptVar1 = commandret;
    pcVar3 = newstring((char *)skip_local);
    tagval::setstr(ptVar1,pcVar3);
  }
  else {
    start = (char *)skip_local;
    local_60 = skip_local;
    if ((0 < local_30) &&
       (bVar2 = parselist((char **)&skip_local,&end,&qstart,&start,(char **)&local_60), bVar2)) {
      do {
        local_30 = local_30 + -1;
        local_71 = false;
        if (0 < local_30) {
          local_71 = parselist((char **)&skip_local,&end,&qstart,&qend,(char **)&local_60);
        }
      } while (local_71 != false);
    }
    ptVar1 = commandret;
    pcVar3 = newstring(start,(long)local_60 - (long)start);
    tagval::setstr(ptVar1,pcVar3);
  }
  return;
}

Assistant:

void sublist(const char *s, int *skip, int *count, int *numargs)
{
    int offset = max(*skip, 0), len = *numargs >= 3 ? max(*count, 0) : -1;
    loopi(offset) if(!parselist(s)) break;
    if(len < 0) { if(offset > 0) skiplist(s); commandret->setstr(newstring(s)); return; }
    const char *list = s, *start, *end, *qstart, *qend = s;
    if(len > 0 && parselist(s, start, end, list, qend)) while(--len > 0 && parselist(s, start, end, qstart, qend));
    commandret->setstr(newstring(list, qend - list));
}